

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::InternalSwap
          (VisionFeaturePrint_Objects *this,VisionFeaturePrint_Objects *other)

{
  VisionFeaturePrint_Objects *other_local;
  VisionFeaturePrint_Objects *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->output_).super_RepeatedPtrFieldBase,
             &(other->output_).super_RepeatedPtrFieldBase);
  std::swap<int>(&this->version_,&other->version_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void VisionFeaturePrint_Objects::InternalSwap(VisionFeaturePrint_Objects* other) {
  output_.InternalSwap(&other->output_);
  std::swap(version_, other->version_);
  std::swap(_cached_size_, other->_cached_size_);
}